

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ransac.c
# Opt level: O0

_Bool find_rotzoom(Correspondence *points,int *indices,int num_indices,double *params)

{
  int iVar1;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  double dy;
  double dx;
  double sy;
  double sx;
  int index;
  int i;
  double b;
  double a [4];
  double y [4];
  double mat [16];
  int n;
  double *in_stack_fffffffffffffed8;
  double *in_stack_fffffffffffffee0;
  double *in_stack_fffffffffffffee8;
  double *in_stack_fffffffffffffef0;
  int local_104;
  double local_f8 [2];
  double *local_e8;
  double *local_e0;
  double local_d8 [4];
  double local_b8 [17];
  undefined4 local_2c;
  long local_28;
  int local_1c;
  long local_18;
  long local_10;
  
  local_2c = 4;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  least_squares_init(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,0);
  for (local_104 = 0; local_104 < local_1c; local_104 = local_104 + 1) {
    iVar1 = *(int *)(local_18 + (long)local_104 * 4);
    in_stack_fffffffffffffef0 = *(double **)(local_10 + (long)iVar1 * 0x20);
    in_stack_fffffffffffffee8 = *(double **)(local_10 + (long)iVar1 * 0x20 + 8);
    in_stack_fffffffffffffee0 = *(double **)(local_10 + (long)iVar1 * 0x20 + 0x10);
    in_stack_fffffffffffffed8 = *(double **)(local_10 + (long)iVar1 * 0x20 + 0x18);
    local_f8[0] = 1.0;
    local_f8[1] = 0.0;
    local_e8 = in_stack_fffffffffffffef0;
    local_e0 = in_stack_fffffffffffffee8;
    least_squares_accumulate(local_b8,local_d8,local_f8,(double)in_stack_fffffffffffffee0,4);
    local_f8[0] = 0.0;
    local_f8[1] = 1.0;
    local_e0 = (double *)((ulong)in_stack_fffffffffffffef0 ^ 0x8000000000000000);
    local_e8 = in_stack_fffffffffffffee8;
    least_squares_accumulate(local_b8,local_d8,local_f8,(double)in_stack_fffffffffffffed8,4);
  }
  iVar1 = least_squares_solve(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                              in_stack_fffffffffffffee0,
                              (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
  if (iVar1 != 0) {
    *(ulong *)(local_28 + 0x20) = *(ulong *)(local_28 + 0x18) ^ 0x8000000000000000;
    *(undefined8 *)(local_28 + 0x28) = *(undefined8 *)(local_28 + 0x10);
  }
  return iVar1 != 0;
}

Assistant:

static bool find_rotzoom(const Correspondence *points, const int *indices,
                         int num_indices, double *params) {
  const int n = 4;    // Size of least-squares problem
  double mat[4 * 4];  // Accumulator for A'A
  double y[4];        // Accumulator for A'b
  double a[4];        // Single row of A
  double b;           // Single element of b

  least_squares_init(mat, y, n);
  for (int i = 0; i < num_indices; ++i) {
    int index = indices[i];
    const double sx = points[index].x;
    const double sy = points[index].y;
    const double dx = points[index].rx;
    const double dy = points[index].ry;

    a[0] = 1;
    a[1] = 0;
    a[2] = sx;
    a[3] = sy;
    b = dx;
    least_squares_accumulate(mat, y, a, b, n);

    a[0] = 0;
    a[1] = 1;
    a[2] = sy;
    a[3] = -sx;
    b = dy;
    least_squares_accumulate(mat, y, a, b, n);
  }

  // Fill in params[0] .. params[3] with output model
  if (!least_squares_solve(mat, y, params, n)) {
    return false;
  }

  // Fill in remaining parameters
  params[4] = -params[3];
  params[5] = params[2];

  return true;
}